

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_perftest.cc
# Opt level: O0

bool WriteTestData(string *err)

{
  pointer *__s;
  bool bVar1;
  ulong uVar2;
  reference ppEVar3;
  int local_35c;
  char local_358 [4];
  int i_2;
  char buf_1 [80];
  undefined1 local_300 [4];
  int i_1;
  string build_rules;
  undefined1 local_2d8 [4];
  int kNumCommands;
  ManifestParserOptions local_2b8;
  undefined1 local_2b0 [8];
  ManifestParser parser;
  State state;
  char buf [80];
  uint local_f0;
  allocator<char> local_e9;
  int i;
  string long_rule_command;
  size_t kRuleSize;
  allocator<char> local_a9;
  string local_a8;
  BuildLogUser local_88;
  NoDeadPaths no_dead_paths;
  BuildLog log;
  string *err_local;
  
  BuildLog::BuildLog((BuildLog *)&no_dead_paths);
  NoDeadPaths::NoDeadPaths((NoDeadPaths *)&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"BuildLogPerfTest-tempfile",&local_a9);
  bVar1 = BuildLog::OpenForWrite((BuildLog *)&no_dead_paths,&local_a8,&local_88,err);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    long_rule_command.field_2._8_8_ = 4000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i,"gcc ",&local_e9);
    std::allocator<char>::~allocator(&local_e9);
    local_f0 = 0;
    while( true ) {
      uVar2 = std::__cxx11::string::size();
      if (3999 < uVar2) break;
      __s = &state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      sprintf((char *)__s,"-I../../and/arbitrary/but/fairly/long/path/suffixed/%d ",(ulong)local_f0)
      ;
      std::__cxx11::string::operator+=((string *)&i,(char *)__s);
      local_f0 = local_f0 + 1;
    }
    std::__cxx11::string::operator+=((string *)&i,"$in -o $out\n");
    State::State((State *)&parser.quiet_);
    ManifestParserOptions::ManifestParserOptions(&local_2b8);
    ManifestParser::ManifestParser
              ((ManifestParser *)local_2b0,(State *)&parser.quiet_,(FileReader *)0x0,local_2b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "rule cxx\n  command = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    bVar1 = ManifestParser::ParseTest((ManifestParser *)local_2b0,(string *)local_2d8,err);
    std::__cxx11::string::~string((string *)local_2d8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      build_rules.field_2._12_4_ = 30000;
      std::__cxx11::string::string((string *)local_300);
      buf_1[0x4c] = '\0';
      buf_1[0x4d] = '\0';
      buf_1[0x4e] = '\0';
      buf_1[0x4f] = '\0';
      for (; (int)buf_1._76_4_ < 30000; buf_1._76_4_ = buf_1._76_4_ + 1) {
        sprintf(local_358,"build input%d.o: cxx input%d.cc\n",(ulong)(uint)buf_1._76_4_);
        std::__cxx11::string::operator+=((string *)local_300,local_358);
      }
      bVar1 = ManifestParser::ParseTest((ManifestParser *)local_2b0,(string *)local_300,err);
      if (bVar1) {
        for (local_35c = 0; local_35c < 30000; local_35c = local_35c + 1) {
          ppEVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                              ((vector<Edge_*,_std::allocator<Edge_*>_> *)
                               &state.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (long)local_35c);
          BuildLog::RecordCommand
                    ((BuildLog *)&no_dead_paths,*ppEVar3,local_35c * 100,local_35c * 100 + 1,0);
        }
        err_local._7_1_ = true;
      }
      else {
        err_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_300);
    }
    else {
      err_local._7_1_ = false;
    }
    State::~State((State *)&parser.quiet_);
    std::__cxx11::string::~string((string *)&i);
  }
  else {
    err_local._7_1_ = false;
  }
  BuildLog::~BuildLog((BuildLog *)&no_dead_paths);
  return err_local._7_1_;
}

Assistant:

bool WriteTestData(string* err) {
  BuildLog log;

  NoDeadPaths no_dead_paths;
  if (!log.OpenForWrite(kTestFilename, no_dead_paths, err))
    return false;

  /*
  A histogram of command lengths in chromium. For example, 407 builds,
  1.4% of all builds, had commands longer than 32 bytes but shorter than 64.
       32    407   1.4%
       64    183   0.6%
      128   1461   5.1%
      256    791   2.8%
      512   1314   4.6%
     1024   6114  21.3%
     2048  11759  41.0%
     4096   2056   7.2%
     8192   4567  15.9%
    16384     13   0.0%
    32768      4   0.0%
    65536      5   0.0%
  The average command length is 4.1 kB and there were 28674 commands in total,
  which makes for a total log size of ~120 MB (also counting output filenames).

  Based on this, write 30000 many 4 kB long command lines.
  */

  // ManifestParser is the only object allowed to create Rules.
  const size_t kRuleSize = 4000;
  string long_rule_command = "gcc ";
  for (int i = 0; long_rule_command.size() < kRuleSize; ++i) {
    char buf[80];
    sprintf(buf, "-I../../and/arbitrary/but/fairly/long/path/suffixed/%d ", i);
    long_rule_command += buf;
  }
  long_rule_command += "$in -o $out\n";

  State state;
  ManifestParser parser(&state, NULL);
  if (!parser.ParseTest("rule cxx\n  command = " + long_rule_command, err))
    return false;

  // Create build edges. Using ManifestParser is as fast as using the State api
  // for edge creation, so just use that.
  const int kNumCommands = 30000;
  string build_rules;
  for (int i = 0; i < kNumCommands; ++i) {
    char buf[80];
    sprintf(buf, "build input%d.o: cxx input%d.cc\n", i, i);
    build_rules += buf;
  }

  if (!parser.ParseTest(build_rules, err))
    return false;

  for (int i = 0; i < kNumCommands; ++i) {
    log.RecordCommand(state.edges_[i],
                      /*start_time=*/100 * i,
                      /*end_time=*/100 * i + 1,
                      /*mtime=*/0);
  }

  return true;
}